

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderMaxPatchVertices.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderMaxPatchVertices::initVertexBufferObjects
          (TessellationShaderMaxPatchVertices *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  GLfloat *pGVar5;
  TestError *pTVar6;
  GLint *pGVar7;
  int local_28;
  int i;
  Functions *gl;
  TessellationShaderMaxPatchVertices *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  pGVar5 = (GLfloat *)malloc((long)(this->m_gl_max_patch_vertices << 2) << 2);
  this->m_patch_vertices_f = pGVar5;
  if (this->m_patch_vertices_f == (GLfloat *)0x0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Memory allocation failed!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
               ,0x196);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pGVar7 = (GLint *)malloc((long)(this->m_gl_max_patch_vertices << 2) << 2);
  this->m_patch_vertices_i = pGVar7;
  if (this->m_patch_vertices_i == (GLint *)0x0) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Memory allocation failed!",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
               ,0x19d);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  for (local_28 = 0; local_28 < this->m_gl_max_patch_vertices * 4; local_28 = local_28 + 4) {
    this->m_patch_vertices_f[local_28] = 1.0;
    this->m_patch_vertices_f[local_28 + 1] = 2.0;
    this->m_patch_vertices_f[local_28 + 2] = 3.0;
    this->m_patch_vertices_f[local_28 + 3] = 4.0;
    this->m_patch_vertices_i[local_28] = 1;
    this->m_patch_vertices_i[local_28 + 1] = 2;
    this->m_patch_vertices_i[local_28 + 2] = 3;
    this->m_patch_vertices_i[local_28 + 3] = 4;
  }
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_patch_vertices_bo_f_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1af);
  (**(code **)(lVar4 + 0x40))(0x8892,this->m_patch_vertices_bo_f_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1b2);
  (**(code **)(lVar4 + 0x150))
            (0x8892,(long)(this->m_gl_max_patch_vertices << 2) << 2,this->m_patch_vertices_f,0x88e4)
  ;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBufferData() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1b6);
  (**(code **)(lVar4 + 0x19f0))(0,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer(fv) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1be);
  (**(code **)(lVar4 + 0x610))(0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray(fv) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1c1);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  (**(code **)(lVar4 + 0x6c8))(1,&this->m_patch_vertices_bo_i_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenBuffers(ARRAY_BUFFER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1c7);
  (**(code **)(lVar4 + 0x40))(0x8892,this->m_patch_vertices_bo_i_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer(ARRAY_BUFFER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1ca);
  (**(code **)(lVar4 + 0x150))
            (0x8892,(long)(this->m_gl_max_patch_vertices << 2) << 2,this->m_patch_vertices_i,0x88e4)
  ;
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBufferData(ARRAY_BUFFER) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1ce);
  (**(code **)(lVar4 + 0x1958))(1,4,0x1404,0,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glVertexAttribPointer(iv) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1d4);
  (**(code **)(lVar4 + 0x610))(1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glEnableVertexAttribArray(iv) failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1d7);
  (**(code **)(lVar4 + 0x40))(0x8892,0);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindBuffer() failed!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderMaxPatchVertices.cpp"
                  ,0x1da);
  return;
}

Assistant:

void TessellationShaderMaxPatchVertices::initVertexBufferObjects(void)
{
	/* Retrieve ES entry/state points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Input patch vertices buffer setup. */
	m_patch_vertices_f = (glw::GLfloat*)malloc(m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLfloat));

	if (m_patch_vertices_f == DE_NULL)
	{
		TCU_FAIL("Memory allocation failed!");
	}

	m_patch_vertices_i = (glw::GLint*)malloc(m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLint));

	if (m_patch_vertices_i == DE_NULL)
	{
		TCU_FAIL("Memory allocation failed!");
	}

	for (int i = 0; i < m_gl_max_patch_vertices * 4 /* components */; i += 4 /* components */)
	{
		m_patch_vertices_f[i]	 = 1.0f;
		m_patch_vertices_f[i + 1] = 2.0f;
		m_patch_vertices_f[i + 2] = 3.0f;
		m_patch_vertices_f[i + 3] = 4.0f;

		m_patch_vertices_i[i]	 = 1;
		m_patch_vertices_i[i + 1] = 2;
		m_patch_vertices_i[i + 2] = 3;
		m_patch_vertices_i[i + 3] = 4;
	}

	/* Vec4 vertex attribute array setup. */
	gl.genBuffers(1, &m_patch_vertices_bo_f_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_patch_vertices_bo_f_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");

	gl.bufferData(GL_ARRAY_BUFFER, m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLfloat),
				  m_patch_vertices_f, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed!");

	gl.vertexAttribPointer(0,		 /* index */
						   4,		 /* size */
						   GL_FLOAT, /* type */
						   GL_FALSE, /* normalized */
						   0,		 /* stride */
						   0);		 /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer(fv) failed!");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray(fv) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);

	/* Ivec4 vertex attribute array setup. */
	gl.genBuffers(1, &m_patch_vertices_bo_i_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers(ARRAY_BUFFER) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_patch_vertices_bo_i_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer(ARRAY_BUFFER) failed!");

	gl.bufferData(GL_ARRAY_BUFFER, m_gl_max_patch_vertices * 4 /* components */ * sizeof(glw::GLint),
				  m_patch_vertices_i, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData(ARRAY_BUFFER) failed!");

	gl.vertexAttribIPointer(1,		   /* index */
							4,		   /* size */
							GL_INT, 0, /* stride */
							0);		   /* pointer */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribPointer(iv) failed!");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray(iv) failed!");

	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed!");
}